

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O1

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddCompositeConstruct
          (InstructionBuilder *this,uint32_t type,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *ids)

{
  pointer puVar1;
  IRContext *c;
  InstructionBuilder *this_00;
  uint32_t res_id;
  Instruction *pIVar2;
  pointer puVar3;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> construct
  ;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> ops;
  size_type __dnew;
  uint local_9c;
  function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)> *local_98
  ;
  InstructionBuilder *local_90;
  initializer_list<unsigned_int> local_88;
  size_t local_78 [2];
  OperandList local_68;
  spv_position_t local_48;
  
  local_68.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar3 = (ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_90 = this;
  if (puVar3 != puVar1) {
    do {
      local_9c = *puVar3;
      local_48.line = CONCAT44(local_48.line._4_4_,1);
      local_88._M_len = 1;
      local_88._M_array = &local_9c;
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      emplace_back<spv_operand_type_t,std::initializer_list<unsigned_int>>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_68,
                 (spv_operand_type_t *)&local_48,&local_88);
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar1);
  }
  pIVar2 = (Instruction *)operator_new(0x70);
  this_00 = local_90;
  c = local_90->context_;
  res_id = Module::TakeNextIdBound
                     ((c->module_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                      .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  if ((res_id == 0) && ((c->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_98 = &c->consumer_;
    local_88._M_array = (iterator)local_78;
    local_48.line = 0x25;
    local_88._M_array =
         (iterator)std::__cxx11::string::_M_create((ulong *)&local_88,(ulong)&local_48);
    local_78[0] = local_48.line;
    *(undefined8 *)local_88._M_array = 0x667265766f204449;
    *(undefined8 *)((long)local_88._M_array + 8) = 0x797254202e776f6c;
    *(undefined8 *)((long)local_88._M_array + 0x10) = 0x676e696e6e757220;
    *(undefined8 *)((long)local_88._M_array + 0x18) = 0x746361706d6f6320;
    builtin_strncpy((char *)((long)local_88._M_array + 0x1d),"act-ids.",8);
    local_88._M_len = local_48.line;
    *(char *)((long)local_88._M_array + local_48.line) = '\0';
    local_48.line = 0;
    local_48.column = 0;
    local_48.index = 0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(local_98,SPV_MSG_ERROR,"",&local_48,(char *)local_88._M_array);
    if ((size_t *)local_88._M_array != local_78) {
      operator_delete(local_88._M_array,local_78[0] + 1);
    }
  }
  Instruction::Instruction(pIVar2,c,OpCompositeConstruct,type,res_id,&local_68);
  local_88._M_array = (iterator)pIVar2;
  pIVar2 = AddInstruction(this_00,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                   *)&local_88);
  if ((Instruction *)local_88._M_array != (Instruction *)0x0) {
    (*((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_88._M_array)->_vptr_IntrusiveNodeBase
      [1])();
  }
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_68);
  return pIVar2;
}

Assistant:

Instruction* AddCompositeConstruct(uint32_t type,
                                     const std::vector<uint32_t>& ids) {
    std::vector<Operand> ops;
    for (auto id : ids) {
      ops.emplace_back(SPV_OPERAND_TYPE_ID,
                       std::initializer_list<uint32_t>{id});
    }
    // TODO(1841): Handle id overflow.
    std::unique_ptr<Instruction> construct(
        new Instruction(GetContext(), spv::Op::OpCompositeConstruct, type,
                        GetContext()->TakeNextId(), ops));
    return AddInstruction(std::move(construct));
  }